

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

int __thiscall pybind11::detail::enum_base::init(enum_base *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  internals *piVar1;
  char in_DL;
  handle property;
  handle static_property;
  handle local_a0;
  cpp_function local_98;
  is_method local_90;
  is_method local_88;
  type local_79;
  object local_78 [2];
  PyObject *local_68;
  char *local_60;
  object local_58;
  undefined4 local_4c;
  handle local_48;
  char local_3c;
  cpp_function local_38;
  
  dict::dict((dict *)&local_48);
  local_68 = (this->m_base).m_ptr;
  local_60 = "__entries";
  local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
  accessor_policies::str_attr::set((handle)local_68,"__entries",local_48);
  object::~object(&local_58);
  object::~object((object *)&local_48);
  local_48.m_ptr = (PyObject *)&PyProperty_Type;
  piVar1 = get_internals();
  local_38.super_function.super_object.super_handle.m_ptr = (function)piVar1->static_property_type;
  local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129b82;
  local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::handle)_1_,pybind11::name,pybind11::is_method,void>
            ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
  local_68 = (this->m_base).m_ptr;
  local_60 = "__repr__";
  local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
  accessor_policies::str_attr::set((handle)local_68,"__repr__",local_a0);
  object::~object(&local_58);
  object::~object((object *)&local_a0);
  local_88.class_.m_ptr = (handle)((long)"\" with a function of the same name" + 0x1e);
  local_90.class_.m_ptr = (handle)(this->m_base).m_ptr;
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::handle)_2_,pybind11::name,pybind11::is_method,void>
            (&local_98,(type *)local_78,(name *)&local_88,&local_90);
  object_api<pybind11::handle>::operator()
            ((object_api<pybind11::handle> *)&local_a0,(cpp_function *)&local_48);
  local_4c = SUB84(ctx,0);
  local_68 = (this->m_base).m_ptr;
  local_60 = "name";
  local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_3c = in_DL;
  accessor_policies::str_attr::set((handle)local_68,"name",local_a0);
  object::~object(&local_58);
  object::~object((object *)&local_a0);
  object::~object((object *)&local_98);
  local_88.class_.m_ptr = (handle)(PyObject *)0x129b8b;
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::handle)_3_,pybind11::name,void>
            (&local_98,&local_79,(name *)&local_88);
  local_90.class_.m_ptr = (handle)&_Py_NoneStruct;
  local_78[0].super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 2;
  object_api<pybind11::handle>::operator()
            ((object_api<pybind11::handle> *)&local_a0,&local_38,(none *)&local_98,(none *)&local_90
             ,(char (*) [1])local_78);
  local_68 = (this->m_base).m_ptr;
  local_60 = "__doc__";
  local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
  accessor_policies::str_attr::set((handle)local_68,"__doc__",local_a0);
  object::~object(&local_58);
  object::~object((object *)&local_a0);
  object::~object(local_78);
  object::~object((object *)&local_90);
  object::~object((object *)&local_98);
  local_88.class_.m_ptr = (handle)(PyObject *)0x129b93;
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::handle)_4_,pybind11::name,void>
            (&local_98,(type *)&local_79,(name *)&local_88);
  local_90.class_.m_ptr = (handle)&_Py_NoneStruct;
  local_78[0].super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 2;
  object_api<pybind11::handle>::operator()
            ((object_api<pybind11::handle> *)&local_a0,&local_38,(none *)&local_98,(none *)&local_90
             ,(char (*) [1])local_78);
  local_68 = (this->m_base).m_ptr;
  local_60 = "__members__";
  local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
  accessor_policies::str_attr::set((handle)local_68,"__members__",local_a0);
  object::~object(&local_58);
  object::~object((object *)&local_a0);
  object::~object(local_78);
  object::~object((object *)&local_90);
  object::~object((object *)&local_98);
  if (local_3c == '\0') {
    local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129b9f;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_13_,pybind11::name,pybind11::is_method,void>
              ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
    local_68 = (this->m_base).m_ptr;
    local_60 = "__eq__";
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_68,"__eq__",local_a0);
    object::~object(&local_58);
    object::~object((object *)&local_a0);
    local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129ba6;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_14_,pybind11::name,pybind11::is_method,void>
              ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
    local_68 = (this->m_base).m_ptr;
    local_60 = "__ne__";
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_68,"__ne__",local_a0);
    object::~object(&local_58);
    object::~object((object *)&local_a0);
    if ((char)local_4c == '\0') goto LAB_0011900f;
    local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129bad;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_15_,pybind11::name,pybind11::is_method,void>
              ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
    local_68 = (this->m_base).m_ptr;
    local_60 = "__lt__";
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_68,"__lt__",local_a0);
    object::~object(&local_58);
    object::~object((object *)&local_a0);
    local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129bb4;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_16_,pybind11::name,pybind11::is_method,void>
              ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
    local_68 = (this->m_base).m_ptr;
    local_60 = "__gt__";
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_68,"__gt__",local_a0);
    object::~object(&local_58);
    object::~object((object *)&local_a0);
    local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129bbb;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_17_,pybind11::name,pybind11::is_method,void>
              ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
    local_68 = (this->m_base).m_ptr;
    local_60 = "__le__";
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_68,"__le__",local_a0);
    object::~object(&local_58);
    object::~object((object *)&local_a0);
    local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129bc2;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_18_,pybind11::name,pybind11::is_method,void>
              ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
    local_68 = (this->m_base).m_ptr;
    local_60 = "__ge__";
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_68,"__ge__",local_a0);
  }
  else {
    local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129b9f;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_1_,pybind11::name,pybind11::is_method,void>
              ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
    local_68 = (this->m_base).m_ptr;
    local_60 = "__eq__";
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_68,"__eq__",local_a0);
    object::~object(&local_58);
    object::~object((object *)&local_a0);
    local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129ba6;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_2_,pybind11::name,pybind11::is_method,void>
              ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
    local_68 = (this->m_base).m_ptr;
    local_60 = "__ne__";
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_68,"__ne__",local_a0);
    object::~object(&local_58);
    object::~object((object *)&local_a0);
    if ((char)local_4c == '\0') goto LAB_0011900f;
    local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129bad;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_3_,pybind11::name,pybind11::is_method,void>
              ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
    local_68 = (this->m_base).m_ptr;
    local_60 = "__lt__";
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_68,"__lt__",local_a0);
    object::~object(&local_58);
    object::~object((object *)&local_a0);
    local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129bb4;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_4_,pybind11::name,pybind11::is_method,void>
              ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
    local_68 = (this->m_base).m_ptr;
    local_60 = "__gt__";
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_68,"__gt__",local_a0);
    object::~object(&local_58);
    object::~object((object *)&local_a0);
    local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129bbb;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_5_,pybind11::name,pybind11::is_method,void>
              ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
    local_68 = (this->m_base).m_ptr;
    local_60 = "__le__";
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_68,"__le__",local_a0);
    object::~object(&local_58);
    object::~object((object *)&local_a0);
    local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129bc2;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_6_,pybind11::name,pybind11::is_method,void>
              ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
    local_68 = (this->m_base).m_ptr;
    local_60 = "__ge__";
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_68,"__ge__",local_a0);
    object::~object(&local_58);
    object::~object((object *)&local_a0);
    local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129bc9;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_7_,pybind11::name,pybind11::is_method,void>
              ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
    local_68 = (this->m_base).m_ptr;
    local_60 = "__and__";
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_68,"__and__",local_a0);
    object::~object(&local_58);
    object::~object((object *)&local_a0);
    local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129bd1;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_8_,pybind11::name,pybind11::is_method,void>
              ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
    local_68 = (this->m_base).m_ptr;
    local_60 = "__rand__";
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_68,"__rand__",local_a0);
    object::~object(&local_58);
    object::~object((object *)&local_a0);
    local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129bda;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_9_,pybind11::name,pybind11::is_method,void>
              ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
    local_68 = (this->m_base).m_ptr;
    local_60 = "__or__";
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_68,"__or__",local_a0);
    object::~object(&local_58);
    object::~object((object *)&local_a0);
    local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129be1;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_10_,pybind11::name,pybind11::is_method,void>
              ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
    local_68 = (this->m_base).m_ptr;
    local_60 = "__ror__";
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_68,"__ror__",local_a0);
    object::~object(&local_58);
    object::~object((object *)&local_a0);
    local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129be9;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_11_,pybind11::name,pybind11::is_method,void>
              ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
    local_68 = (this->m_base).m_ptr;
    local_60 = "__xor__";
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_68,"__xor__",local_a0);
    object::~object(&local_58);
    object::~object((object *)&local_a0);
    local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129bf1;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_12_,pybind11::name,pybind11::is_method,void>
              ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
    local_68 = (this->m_base).m_ptr;
    local_60 = "__rxor__";
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_68,"__rxor__",local_a0);
    object::~object(&local_58);
    object::~object((object *)&local_a0);
    local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129bfa;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object)_1_,pybind11::name,pybind11::is_method,void>
              ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
    local_68 = (this->m_base).m_ptr;
    local_60 = "__invert__";
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_68,"__invert__",local_a0);
  }
  object::~object(&local_58);
  object::~object((object *)&local_a0);
LAB_0011900f:
  local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129c05;
  local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object)_2_,pybind11::name,pybind11::is_method,void>
            ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
  local_68 = (this->m_base).m_ptr;
  local_60 = "__getstate__";
  local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
  accessor_policies::str_attr::set((handle)local_68,"__getstate__",local_a0);
  object::~object(&local_58);
  object::~object((object *)&local_a0);
  local_98.super_function.super_object.super_handle.m_ptr = (function)(object)0x129c12;
  local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object)_3_,pybind11::name,pybind11::is_method,void>
            ((cpp_function *)&local_a0,(type *)&local_90,(name *)&local_98,&local_88);
  local_68 = (this->m_base).m_ptr;
  local_60 = "__hash__";
  local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
  accessor_policies::str_attr::set((handle)local_68,"__hash__",local_a0);
  object::~object(&local_58);
  object::~object((object *)&local_a0);
  return extraout_EAX;
}

Assistant:

PYBIND11_NOINLINE void init(bool is_arithmetic, bool is_convertible) {
        m_base.attr("__entries") = dict();
        auto property = handle((PyObject *) &PyProperty_Type);
        auto static_property = handle((PyObject *) get_internals().static_property_type);

        m_base.attr("__repr__") = cpp_function(
            [](handle arg) -> str {
                handle type = arg.get_type();
                object type_name = type.attr("__name__");
                dict entries = type.attr("__entries");
                for (const auto &kv : entries) {
                    object other = kv.second[int_(0)];
                    if (other.equal(arg))
                        return pybind11::str("{}.{}").format(type_name, kv.first);
                }
                return pybind11::str("{}.???").format(type_name);
            }, name("__repr__"), is_method(m_base)
        );

        m_base.attr("name") = property(cpp_function(
            [](handle arg) -> str {
                dict entries = arg.get_type().attr("__entries");
                for (const auto &kv : entries) {
                    if (handle(kv.second[int_(0)]).equal(arg))
                        return pybind11::str(kv.first);
                }
                return "???";
            }, name("name"), is_method(m_base)
        ));

        m_base.attr("__doc__") = static_property(cpp_function(
            [](handle arg) -> std::string {
                std::string docstring;
                dict entries = arg.attr("__entries");
                if (((PyTypeObject *) arg.ptr())->tp_doc)
                    docstring += std::string(((PyTypeObject *) arg.ptr())->tp_doc) + "\n\n";
                docstring += "Members:";
                for (const auto &kv : entries) {
                    auto key = std::string(pybind11::str(kv.first));
                    auto comment = kv.second[int_(1)];
                    docstring += "\n\n  " + key;
                    if (!comment.is_none())
                        docstring += " : " + (std::string) pybind11::str(comment);
                }
                return docstring;
            }, name("__doc__")
        ), none(), none(), "");

        m_base.attr("__members__") = static_property(cpp_function(
            [](handle arg) -> dict {
                dict entries = arg.attr("__entries"), m;
                for (const auto &kv : entries)
                    m[kv.first] = kv.second[int_(0)];
                return m;
            }, name("__members__")), none(), none(), ""
        );

        #define PYBIND11_ENUM_OP_STRICT(op, expr, strict_behavior)                     \
            m_base.attr(op) = cpp_function(                                            \
                [](object a, object b) {                                               \
                    if (!a.get_type().is(b.get_type()))                                \
                        strict_behavior;                                               \
                    return expr;                                                       \
                },                                                                     \
                name(op), is_method(m_base))

        #define PYBIND11_ENUM_OP_CONV(op, expr)                                        \
            m_base.attr(op) = cpp_function(                                            \
                [](object a_, object b_) {                                             \
                    int_ a(a_), b(b_);                                                 \
                    return expr;                                                       \
                },                                                                     \
                name(op), is_method(m_base))

        #define PYBIND11_ENUM_OP_CONV_LHS(op, expr)                                    \
            m_base.attr(op) = cpp_function(                                            \
                [](object a_, object b) {                                              \
                    int_ a(a_);                                                        \
                    return expr;                                                       \
                },                                                                     \
                name(op), is_method(m_base))

        if (is_convertible) {
            PYBIND11_ENUM_OP_CONV_LHS("__eq__", !b.is_none() &&  a.equal(b));
            PYBIND11_ENUM_OP_CONV_LHS("__ne__",  b.is_none() || !a.equal(b));

            if (is_arithmetic) {
                PYBIND11_ENUM_OP_CONV("__lt__",   a <  b);
                PYBIND11_ENUM_OP_CONV("__gt__",   a >  b);
                PYBIND11_ENUM_OP_CONV("__le__",   a <= b);
                PYBIND11_ENUM_OP_CONV("__ge__",   a >= b);
                PYBIND11_ENUM_OP_CONV("__and__",  a &  b);
                PYBIND11_ENUM_OP_CONV("__rand__", a &  b);
                PYBIND11_ENUM_OP_CONV("__or__",   a |  b);
                PYBIND11_ENUM_OP_CONV("__ror__",  a |  b);
                PYBIND11_ENUM_OP_CONV("__xor__",  a ^  b);
                PYBIND11_ENUM_OP_CONV("__rxor__", a ^  b);
                m_base.attr("__invert__") = cpp_function(
                    [](object arg) { return ~(int_(arg)); }, name("__invert__"), is_method(m_base));
            }
        } else {
            PYBIND11_ENUM_OP_STRICT("__eq__",  int_(a).equal(int_(b)), return false);
            PYBIND11_ENUM_OP_STRICT("__ne__", !int_(a).equal(int_(b)), return true);

            if (is_arithmetic) {
                #define PYBIND11_THROW throw type_error("Expected an enumeration of matching type!");
                PYBIND11_ENUM_OP_STRICT("__lt__", int_(a) <  int_(b), PYBIND11_THROW);
                PYBIND11_ENUM_OP_STRICT("__gt__", int_(a) >  int_(b), PYBIND11_THROW);
                PYBIND11_ENUM_OP_STRICT("__le__", int_(a) <= int_(b), PYBIND11_THROW);
                PYBIND11_ENUM_OP_STRICT("__ge__", int_(a) >= int_(b), PYBIND11_THROW);
                #undef PYBIND11_THROW
            }
        }

        #undef PYBIND11_ENUM_OP_CONV_LHS
        #undef PYBIND11_ENUM_OP_CONV
        #undef PYBIND11_ENUM_OP_STRICT

        m_base.attr("__getstate__") = cpp_function(
            [](object arg) { return int_(arg); }, name("__getstate__"), is_method(m_base));

        m_base.attr("__hash__") = cpp_function(
            [](object arg) { return int_(arg); }, name("__hash__"), is_method(m_base));
    }